

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorProto_ExtensionRange::Swap
          (DescriptorProto_ExtensionRange *this,DescriptorProto_ExtensionRange *other)

{
  int32 iVar1;
  uint32 uVar2;
  int iVar3;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar4;
  
  if (other != this) {
    iVar1 = this->start_;
    this->start_ = other->start_;
    other->start_ = iVar1;
    iVar1 = this->end_;
    this->end_ = other->end_;
    other->end_ = iVar1;
    uVar2 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar2;
    pvVar4 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar4;
    iVar3 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar3;
  }
  return;
}

Assistant:

void DescriptorProto_ExtensionRange::Swap(DescriptorProto_ExtensionRange* other) {
  if (other != this) {
    std::swap(start_, other->start_);
    std::swap(end_, other->end_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}